

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_FSA_dns.c
# Opt level: O0

int PrintFinalStats(void *mem)

{
  undefined8 in_RDI;
  long ncfn;
  long netf;
  long nreLS;
  long nre;
  long nje;
  long nnf;
  long nni;
  long nst;
  int retval;
  undefined8 local_50;
  undefined8 local_48;
  long local_40;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  int local_c;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_c = IDAGetNumSteps(in_RDI,&local_18);
  local_c = IDAGetNumResEvals(local_8,&local_38);
  local_c = IDAGetNumJacEvals(local_8,&local_30);
  local_c = IDAGetNumNonlinSolvIters(local_8,&local_20);
  local_c = IDAGetNumErrTestFails(local_8,&local_48);
  local_c = IDAGetNumNonlinSolvConvFails(local_8,&local_28);
  local_c = IDAGetNumStepSolveFails(local_8,&local_50);
  local_c = IDAGetNumLinResEvals(local_8,&local_40);
  printf("\nFinal Run Statistics: \n\n");
  printf("Number of steps                    = %ld\n",local_18);
  printf("Number of residual evaluations     = %ld\n",local_38 + local_40);
  printf("Number of Jacobian evaluations     = %ld\n",local_30);
  printf("Number of nonlinear iterations     = %ld\n",local_20);
  printf("Number of error test failures      = %ld\n",local_48);
  printf("Number of nonlinear conv. failures = %ld\n",local_28);
  printf("Number of step solver failures     = %ld\n",local_50);
  return local_c;
}

Assistant:

static int PrintFinalStats(void* mem)
{
  int retval;
  long int nst, nni, nnf, nje, nre, nreLS, netf, ncfn;

  retval = IDAGetNumSteps(mem, &nst);
  retval = IDAGetNumResEvals(mem, &nre);
  retval = IDAGetNumJacEvals(mem, &nje);
  retval = IDAGetNumNonlinSolvIters(mem, &nni);
  retval = IDAGetNumErrTestFails(mem, &netf);
  retval = IDAGetNumNonlinSolvConvFails(mem, &nnf);
  retval = IDAGetNumStepSolveFails(mem, &ncfn);
  retval = IDAGetNumLinResEvals(mem, &nreLS);

  printf("\nFinal Run Statistics: \n\n");
  printf("Number of steps                    = %ld\n", nst);
  printf("Number of residual evaluations     = %ld\n", nre + nreLS);
  printf("Number of Jacobian evaluations     = %ld\n", nje);
  printf("Number of nonlinear iterations     = %ld\n", nni);
  printf("Number of error test failures      = %ld\n", netf);
  printf("Number of nonlinear conv. failures = %ld\n", nnf);
  printf("Number of step solver failures     = %ld\n", ncfn);

  return (retval);
}